

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

bool __thiscall
ViconCGStreamIO::VBuffer::Read<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>
          (VBuffer *this,
          vector<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
          *o_rValues)

{
  uint uVar1;
  pointer pVVar2;
  pointer puVar3;
  bool bVar4;
  ulong __new_size;
  pointer this_00;
  
  pVVar2 = (o_rValues->
           super__Vector_base<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((o_rValues->
      super__Vector_base<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
      )._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (o_rValues->
    super__Vector_base<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
    )._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  uVar1 = (this->m_BufferImpl).m_Offset;
  puVar3 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3) < (ulong)uVar1 + 4) {
    bVar4 = false;
  }
  else {
    __new_size = (ulong)*(uint *)(puVar3 + uVar1);
    (this->m_BufferImpl).m_Offset = uVar1 + 4;
    std::
    vector<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
    ::resize(o_rValues,__new_size);
    pVVar2 = (o_rValues->
             super__Vector_base<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this_00 = (pointer)0x0;
    if (pVVar2 != (o_rValues->
                  super__Vector_base<ViconCGStreamDetail::VCentroidTracks_CentroidTrack,_std::allocator<ViconCGStreamDetail::VCentroidTracks_CentroidTrack>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = pVVar2;
    }
    if (__new_size == 0) {
      bVar4 = true;
    }
    else {
      do {
        __new_size = __new_size - 1;
        bVar4 = ViconCGStreamDetail::VCentroidTracks_CentroidTrack::Read
                          (this_00,(this->m_BufferImpl).m_rParent);
        if (!bVar4) {
          return bVar4;
        }
        this_00 = this_00 + 1;
      } while (__new_size != 0);
    }
  }
  return bVar4;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }